

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib.c
# Opt level: O2

void zlib_compress_cleanup(ssh_compressor *sc)

{
  ssh_compression_alg *ptr;
  strbuf *buf_o;
  
  ptr = sc[-3].vt;
  buf_o = (strbuf *)ptr->name;
  if (buf_o != (strbuf *)0x0) {
    strbuf_free(buf_o);
  }
  safefree(ptr);
  safefree(sc[-4].vt);
  safefree(sc + -4);
  return;
}

Assistant:

void zlib_compress_cleanup(ssh_compressor *sc)
{
    struct ssh_zlib_compressor *comp =
        container_of(sc, struct ssh_zlib_compressor, sc);
    struct Outbuf *out = (struct Outbuf *)comp->ectx.userdata;
    if (out->outbuf)
        strbuf_free(out->outbuf);
    sfree(out);
    sfree(comp->ectx.ictx);
    sfree(comp);
}